

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::LaunchRequest>::destruct(BasicTypeInfo<dap::LaunchRequest> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::LaunchRequest> *this_local;
  
  LaunchRequest::~LaunchRequest((LaunchRequest *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }